

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::free_all_blocks(jpeg_decoder *this)

{
  mem_block *pmVar1;
  mem_block *p;
  
  this->m_pStream = (jpeg_decoder_stream *)0x0;
  p = this->m_pMem_blocks;
  while (p != (mem_block *)0x0) {
    pmVar1 = p->m_pNext;
    crnlib::crnlib_free(p);
    p = pmVar1;
  }
  this->m_pMem_blocks = (mem_block *)0x0;
  return;
}

Assistant:

void jpeg_decoder::free_all_blocks() {
  m_pStream = NULL;
  for (mem_block* b = m_pMem_blocks; b;) {
    mem_block* n = b->m_pNext;
    jpgd_free(b);
    b = n;
  }
  m_pMem_blocks = NULL;
}